

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lms.cpp
# Opt level: O2

void __thiscall CGameControllerLMS::DoWincheckRound(CGameControllerLMS *this)

{
  IServer *pIVar1;
  int iVar2;
  CCharacter *pCVar3;
  int iVar4;
  int AlivePlayerCount;
  CPlayer *this_00;
  CPlayer *pCVar5;
  int i;
  long lVar6;
  
  iVar2 = (this->super_IGameController).m_GameInfo.m_TimeLimit;
  if ((iVar2 < 1) ||
     (pIVar1 = (this->super_IGameController).m_pServer,
     iVar4 = pIVar1->m_CurrentGameTick - (this->super_IGameController).m_GameStartTick,
     iVar2 = iVar2 * pIVar1->m_TickSpeed, SBORROW4(iVar4,iVar2 * 0x3c) != iVar4 + iVar2 * -0x3c < 0)
     ) {
    pCVar5 = (CPlayer *)0x0;
    iVar2 = 0;
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      this_00 = ((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6];
      if ((this_00 != (CPlayer *)0x0) && (this_00->m_Team != -1)) {
        if (this_00->m_RespawnDisabled == true) {
          pCVar3 = CPlayer::GetCharacter(this_00);
          if (pCVar3 != (CCharacter *)0x0) {
            pCVar3 = CPlayer::GetCharacter
                               (((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6]);
            if (pCVar3->m_Alive == true) {
              this_00 = ((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6];
              goto LAB_0011bdce;
            }
          }
        }
        else {
LAB_0011bdce:
          iVar2 = iVar2 + 1;
          pCVar5 = this_00;
        }
      }
    }
    if (iVar2 != 0) {
      if (iVar2 != 1) {
        return;
      }
      pCVar5->m_Score = pCVar5->m_Score + 1;
    }
  }
  else {
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      pCVar5 = ((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6];
      if ((pCVar5 != (CPlayer *)0x0) && (pCVar5->m_Team != -1)) {
        if (pCVar5->m_RespawnDisabled == true) {
          pCVar3 = CPlayer::GetCharacter(pCVar5);
          if (pCVar3 != (CCharacter *)0x0) {
            pCVar3 = CPlayer::GetCharacter
                               (((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6]);
            if (pCVar3->m_Alive == true) {
              pCVar5 = ((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6];
              goto LAB_0011be53;
            }
          }
        }
        else {
LAB_0011be53:
          pCVar5->m_Score = pCVar5->m_Score + 1;
        }
      }
    }
  }
  IGameController::EndRound(&this->super_IGameController);
  return;
}

Assistant:

void CGameControllerLMS::DoWincheckRound()
{
	// check for time based win
	if(m_GameInfo.m_TimeLimit > 0 && (Server()->Tick()-m_GameStartTick) >= m_GameInfo.m_TimeLimit*Server()->TickSpeed()*60)
	{
		for(int i = 0; i < MAX_CLIENTS; ++i)
		{
			if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS &&
				(!GameServer()->m_apPlayers[i]->m_RespawnDisabled ||
				(GameServer()->m_apPlayers[i]->GetCharacter() && GameServer()->m_apPlayers[i]->GetCharacter()->IsAlive())))
				GameServer()->m_apPlayers[i]->m_Score++;
		}

		EndRound();
	}
	else
	{
		// check for survival win
		CPlayer *pAlivePlayer = 0;
		int AlivePlayerCount = 0;
		for(int i = 0; i < MAX_CLIENTS; ++i)
		{
			if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS &&
				(!GameServer()->m_apPlayers[i]->m_RespawnDisabled ||
				(GameServer()->m_apPlayers[i]->GetCharacter() && GameServer()->m_apPlayers[i]->GetCharacter()->IsAlive())))
			{
				++AlivePlayerCount;
				pAlivePlayer = GameServer()->m_apPlayers[i];
			}
		}

		if(AlivePlayerCount == 0)		// no winner
			EndRound();
		else if(AlivePlayerCount == 1)	// 1 winner
		{
			pAlivePlayer->m_Score++;
			EndRound();
		}
	}
}